

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

void sk_proxy_set_frozen(Socket *s,_Bool is_frozen)

{
  bufchain *ch;
  byte bVar1;
  size_t sVar2;
  ulong __n;
  ptrlen pVar3;
  char databuf [512];
  undefined1 auStack_238 [520];
  
  if (s[-10].vt != (SocketVtable *)0x0) {
    *(_Bool *)((long)&s[-0xb].vt + 1) = is_frozen;
    return;
  }
  ch = (bufchain *)(s + -0x10);
  sVar2 = bufchain_size(ch);
  if (sVar2 != 0) {
    *(_Bool *)((long)&s[-0xb].vt + 1) = is_frozen;
    if (is_frozen) {
      return;
    }
    do {
      sVar2 = bufchain_size(ch);
      if (sVar2 == 0) {
        bVar1 = *(byte *)((long)&s[-0xb].vt + 1);
        goto LAB_0014369e;
      }
      pVar3 = bufchain_prefix(ch);
      __n = pVar3.len;
      if (0x1ff < __n) {
        __n = 0x200;
      }
      memcpy(auStack_238,pVar3.ptr,__n);
      bufchain_consume(ch,__n);
      (**(code **)((s[-0x1f].vt)->plug + 0x10))(s[-0x1f].vt,0,auStack_238,__n);
    } while (*(char *)((long)&s[-0xb].vt + 1) != '\x01');
    bVar1 = 1;
LAB_0014369e:
    if ((bVar1 & 1) != 0) {
      return;
    }
  }
  (**(code **)((s[-0x20].vt)->plug + 0x28))(s[-0x20].vt,is_frozen);
  return;
}

Assistant:

static void sk_proxy_set_frozen (Socket *s, bool is_frozen)
{
    ProxySocket *ps = container_of(s, ProxySocket, sock);

    if (ps->pn) {
        ps->freeze = is_frozen;
        return;
    }

    /* handle any remaining buffered recv data first */
    if (bufchain_size(&ps->pending_input_data) > 0) {
        ps->freeze = is_frozen;

        /* loop while we still have buffered data, and while we are
         * unfrozen. the plug_receive call in the loop could result
         * in a call back into this function refreezing the socket,
         * so we have to check each time.
         */
        while (!ps->freeze && bufchain_size(&ps->pending_input_data) > 0) {
            char databuf[512];
            ptrlen data = bufchain_prefix(&ps->pending_input_data);
            if (data.len > lenof(databuf))
                data.len = lenof(databuf);
            memcpy(databuf, data.ptr, data.len);
            bufchain_consume(&ps->pending_input_data, data.len);
            plug_receive(ps->plug, 0, databuf, data.len);
        }

        /* if we're still frozen, we'll have to wait for another
         * call from the backend to finish unbuffering the data.
         */
        if (ps->freeze) return;
    }

    sk_set_frozen(ps->sub_socket, is_frozen);
}